

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O3

size_t __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
SpaceUsedExcludingSelfLong<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
          (RepeatedPtrFieldBase *this)

{
  Rep *pRVar1;
  size_t sVar2;
  uint uVar3;
  ulong uVar4;
  size_t sVar5;
  
  if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
    uVar3 = (uint)(this->tagged_rep_or_elem_ != (void *)0x0);
    sVar5 = 0;
  }
  else {
    sVar5 = (long)this->capacity_proxy_ * 8 + 0x10;
    pRVar1 = rep(this);
    uVar3 = pRVar1->allocated_size;
    if (((ulong)this->tagged_rep_or_elem_ & 1) != 0) {
      pRVar1 = rep(this);
      this = (RepeatedPtrFieldBase *)pRVar1->elements;
    }
  }
  if (0 < (int)uVar3) {
    uVar4 = 0;
    do {
      sVar2 = StringSpaceUsedExcludingSelfLong((string *)(&this->tagged_rep_or_elem_)[uVar4]);
      sVar5 = sVar5 + sVar2 + 0x20;
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  return sVar5;
}

Assistant:

PROTOBUF_NOINLINE size_t SpaceUsedExcludingSelfLong() const {
    size_t allocated_bytes =
        using_sso()
            ? 0
            : static_cast<size_t>(Capacity()) * sizeof(void*) + kRepHeaderSize;
    const int n = allocated_size();
    void* const* elems = elements();
    for (int i = 0; i < n; ++i) {
      allocated_bytes +=
          TypeHandler::SpaceUsedLong(*cast<TypeHandler>(elems[i]));
    }
    return allocated_bytes;
  }